

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::HttpInputStream::Response> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readResponse
          (HttpInputStreamImpl *this,HttpMethod requestMethod)

{
  PromiseNode *pPVar1;
  AsyncInputStream *pAVar2;
  TransformPromiseNodeBase *pTVar3;
  undefined4 in_EDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar4;
  undefined4 in_register_00000034;
  Promise<kj::HttpInputStream::Response> PVar5;
  Own<kj::_::PromiseNode> local_40;
  HttpInputStream local_30;
  AsyncInputStream *local_28;
  
  readMessageHeaders((HttpInputStreamImpl *)&stack0xffffffffffffffd0);
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,(Own<kj::_::PromiseNode> *)&stack0xffffffffffffffd0,
             _::
             TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1162:38),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pAVar2 = local_28;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f478;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)CONCAT44(in_register_00000034,requestMethod);
  local_40.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponseHeaders()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
        ::instance;
  local_40.ptr = (PromiseNode *)pTVar3;
  if (local_28 != (AsyncInputStream *)0x0) {
    local_28 = (AsyncInputStream *)0x0;
    (**(code **)*local_30._vptr_HttpInputStream)
              (local_30._vptr_HttpInputStream,
               pAVar2->_vptr_AsyncInputStream[-2] + (long)&pAVar2->_vptr_AsyncInputStream);
  }
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_40,
             _::
             TransformPromiseNode<kj::HttpInputStream::Response,_kj::Maybe<kj::HttpHeaders::Response>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1025:15),_kj::_::PropagateException>
             ::anon_class_16_2_b11f703d_for_func::operator());
  pPVar1 = local_40.ptr;
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045f500;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode =
       (_func_int **)CONCAT44(in_register_00000034,requestMethod);
  *(undefined4 *)&pTVar3[1].dependency.disposer = in_EDX;
  (this->super_HttpInputStream)._vptr_HttpInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponse(kj::HttpMethod)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (AsyncInputStream *)pTVar3;
  pPVar4 = extraout_RDX;
  if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    (**(local_40.disposer)->_vptr_Disposer)
              (local_40.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pPVar4 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar4;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Response>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<Response> readResponse(HttpMethod requestMethod) override {
    return readResponseHeaders()
        .then([this,requestMethod](kj::Maybe<HttpHeaders::Response>&& maybeResponse)
              -> HttpInputStream::Response {
      auto response = KJ_REQUIRE_NONNULL(maybeResponse, "bad response");
      auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, requestMethod, 0, headers);

      return { response.statusCode, response.statusText, headers, kj::mv(body) };
    });
  }